

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerUsageHandler::begin_function_scope
          (CombinedImageSamplerUsageHandler *this,uint32_t *args,uint32_t length)

{
  uint32_t dst;
  SPIRFunction *pSVar1;
  Parameter *pPVar2;
  Parameter *argument;
  uint32_t i;
  uint32_t *arg;
  SPIRFunction *func;
  uint32_t length_local;
  uint32_t *args_local;
  CombinedImageSamplerUsageHandler *this_local;
  
  if (length < 3) {
    this_local._7_1_ = false;
  }
  else {
    pSVar1 = get<spirv_cross::SPIRFunction>(this->compiler,args[2]);
    for (argument._4_4_ = 0; argument._4_4_ < length - 3; argument._4_4_ = argument._4_4_ + 1) {
      pPVar2 = VectorView<spirv_cross::SPIRFunction::Parameter>::operator[]
                         (&(pSVar1->arguments).
                           super_VectorView<spirv_cross::SPIRFunction::Parameter>,
                          (ulong)argument._4_4_);
      dst = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPVar2->id);
      add_dependency(this,dst,args[(ulong)argument._4_4_ + 3]);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::CombinedImageSamplerUsageHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &func = compiler.get<SPIRFunction>(args[2]);
	const auto *arg = &args[3];
	length -= 3;

	for (uint32_t i = 0; i < length; i++)
	{
		auto &argument = func.arguments[i];
		add_dependency(argument.id, arg[i]);
	}

	return true;
}